

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  long _code;
  long lVar1;
  DIResult result;
  DILogger local_1a8;
  
  DIResult::DIResult(&result);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,10,this->_buffers);
  for (lVar1 = 10; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[lVar1 + -10]);
    _code = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,this->_buffers[lVar1 + -10]);
    DIResult::sub_result(&local_1a8,&result,_code);
    DILogger::~DILogger(&local_1a8);
  }
  DILogger::~DILogger(&result.logger_);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		const int buffNum = sizeof(_buffers) / sizeof(_buffers[0]);

		glGenBuffers(buffNum, _buffers);

		for (int i = 0; i < buffNum; ++i)
		{
			glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[i]);
			result.sub_result(BindingPointCheck<api>(_buffers[i]));
		}

		return result.code();
	}